

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servak.cpp
# Opt level: O0

void __thiscall session::run(session *this)

{
  shared_ptr<session> *in_RCX;
  enable_shared_from_this<session> local_80;
  code *local_70;
  undefined8 local_68;
  bind_front_wrapper<void_(session::*)(),_std::shared_ptr<session>_> local_60;
  executor_type local_40;
  session *local_10;
  session *this_local;
  
  local_10 = this;
  boost::beast::
  basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
  ::get_executor(&local_40,&this->stream_);
  local_70 = do_read;
  local_68 = 0;
  std::enable_shared_from_this<session>::shared_from_this(&local_80);
  boost::beast::bind_front_handler<void(session::*)(),std::shared_ptr<session>>
            (&local_60,(beast *)&local_70,(offset_in_session_to_subr *)&local_80,in_RCX);
  boost::asio::
  dispatch<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::detail::bind_front_wrapper<void(session::*)(),std::shared_ptr<session>>>
            (&local_40,&local_60,(type *)0x0);
  boost::beast::detail::bind_front_wrapper<void_(session::*)(),_std::shared_ptr<session>_>::
  ~bind_front_wrapper(&local_60);
  std::shared_ptr<session>::~shared_ptr((shared_ptr<session> *)&local_80);
  boost::asio::execution::
  any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>
  ::~any_executor(&local_40);
  return;
}

Assistant:

void
    run()
    {
        // We need to be executing within a strand to perform async operations
        // on the I/O objects in this session. Although not strictly necessary
        // for single-threaded contexts, this example code is written to be
        // thread-safe by default.
        net::dispatch(stream_.get_executor(),
                      beast::bind_front_handler(
                          &session::do_read,
                          shared_from_this()));
    }